

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O3

errc psql::deserialize_struct<5ul,psql::single_row_description>
               (single_row_description *output,deserialization_context *ctx)

{
  errc eVar1;
  
  eVar1 = serialization_traits<int,_(psql::serialization_tag)1>::deserialize_
                    (&output->type_modifier,ctx);
  if (eVar1 != ok) {
    return eVar1;
  }
  eVar1 = serialization_traits<short,_(psql::serialization_tag)1>::deserialize_(&output->format,ctx)
  ;
  return eVar1;
}

Assistant:

errc deserialize_struct(
	[[maybe_unused]] T& output,
	[[maybe_unused]] deserialization_context& ctx
) noexcept
{
	constexpr auto fields = get_struct_fields<T>::value;
	if constexpr (index == std::tuple_size<decltype(fields)>::value)
	{
		return errc::ok;
	}
	else
	{
		constexpr auto pmem = std::get<index>(fields);
		errc err = deserialize(output.*pmem, ctx);
		if (err != errc::ok)
		{
			return err;
		}
		else
		{
			return deserialize_struct<index+1>(output, ctx);
		}
	}
}